

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gosthash.c
# Opt level: O0

int hash_block(gost_hash_ctx *ctx,byte *block,size_t length)

{
  ulong in_RDX;
  byte *in_RSI;
  long *in_RDI;
  uint add_bytes;
  byte *in_stack_00000080;
  byte *in_stack_00000088;
  gost_ctx *in_stack_00000090;
  uint local_24;
  ulong local_20;
  byte *local_18;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  if ((int)in_RDI[2] != 0) {
    local_24 = 0x20 - (int)in_RDI[2];
    if (in_RDX < local_24) {
      local_24 = (uint)in_RDX;
    }
    memcpy((void *)((long)in_RDI + (long)(int)in_RDI[2] + 0x54),in_RSI,(ulong)local_24);
    *(uint *)(in_RDI + 2) = local_24 + (int)in_RDI[2];
    if ((int)in_RDI[2] < 0x20) {
      return 1;
    }
    local_18 = in_RSI + local_24;
    local_20 = in_RDX - local_24;
    hash_step(in_stack_00000090,in_stack_00000088,in_stack_00000080);
    add_blocks(0x20,(byte *)((long)in_RDI + 0x34),(byte *)((long)in_RDI + 0x54));
    *in_RDI = *in_RDI + 0x20;
    *(undefined4 *)(in_RDI + 2) = 0;
  }
  for (; 0x1f < local_20; local_20 = local_20 - 0x20) {
    hash_step(in_stack_00000090,in_stack_00000088,in_stack_00000080);
    add_blocks(0x20,(byte *)((long)in_RDI + 0x34),local_18);
    *in_RDI = *in_RDI + 0x20;
    local_18 = local_18 + 0x20;
  }
  if (local_20 != 0) {
    *(int *)(in_RDI + 2) = (int)local_20;
    memcpy((void *)((long)in_RDI + 0x54),local_18,(long)(int)local_20);
  }
  return 1;
}

Assistant:

int hash_block(gost_hash_ctx * ctx, const byte * block, size_t length)
{
    if (ctx->left) {
        /*
         * There are some bytes from previous step
         */
        unsigned int add_bytes = 32 - ctx->left;
        if (add_bytes > length) {
            add_bytes = length;
        }
        memcpy(&(ctx->remainder[ctx->left]), block, add_bytes);
        ctx->left += add_bytes;
        if (ctx->left < 32) {
            return 1;
        }
        block += add_bytes;
        length -= add_bytes;
        hash_step(ctx->cipher_ctx, ctx->H, ctx->remainder);
        add_blocks(32, ctx->S, ctx->remainder);
        ctx->len += 32;
        ctx->left = 0;
    }
    while (length >= 32) {
        hash_step(ctx->cipher_ctx, ctx->H, block);

        add_blocks(32, ctx->S, block);
        ctx->len += 32;
        block += 32;
        length -= 32;
    }
    if (length) {
        memcpy(ctx->remainder, block, ctx->left = length);
    }
    return 1;
}